

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardDemodulation.cpp
# Opt level: O1

bool __thiscall
Inferences::ForwardDemodulationImpl<true>::perform
          (ForwardDemodulationImpl<true> *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  int *piVar1;
  Literal ***pppLVar2;
  long *plVar3;
  Term *term;
  DemodulationLHSIndex *pDVar4;
  TermIndexingStructure<Indexing::DemodulatorData> *pTVar5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  Term *pTVar8;
  Self SVar9;
  bool bVar10;
  char cVar11;
  bool bVar12;
  Result RVar13;
  int iVar14;
  void **head;
  TermList rwTerm;
  TermList TVar15;
  void *pvVar16;
  Literal *pLVar17;
  Clause *pCVar18;
  InferenceExtra *extra;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint i;
  EVP_PKEY_CTX *ctx;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData> qr;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
  git;
  RStack<Literal_*> resLits;
  SmartPtr<Indexing::ResultSubstitution> subs;
  type it;
  Applicator applWithoutEqSort;
  ApplicatorWithEqSort applWithEqSort;
  long *local_190;
  int *local_188;
  ulong *local_180;
  long *local_178;
  TermList local_170;
  SimplifyingInference2 local_168;
  Ordering *local_150;
  ClauseIterator *local_148;
  DemodulationHelper *local_140;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_138;
  long *local_128;
  int *local_120;
  _func_int **local_118;
  ulong local_110;
  _func_int **local_108;
  Clause **local_100;
  TermList local_f8;
  uint64_t local_f0;
  byte bStack_e8;
  EVP_PKEY_CTX *local_e0;
  uint64_t local_d8;
  uint uStack_d0;
  undefined8 local_c8;
  FirstOrderSubtermIt local_c0;
  undefined **local_88;
  long *local_80;
  undefined **local_78;
  long *local_70;
  RobSubstitution *local_68;
  Inference local_60;
  
  local_150 = (((this->super_ForwardDemodulation).super_ForwardSimplificationEngine.
                super_InferenceEngine._salg)->_ordering)._obj;
  local_148 = premises;
  local_100 = replacement;
  if (perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::attempted ==
      '\0') {
    perform();
  }
  ::Lib::DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&perform::attempted._map);
  bVar10 = false;
  if ((*(ulong *)&cl->field_0x38 & 0xfffff) != 0) {
    local_140 = &(this->super_ForwardDemodulation)._helper;
    uVar20 = (ulong)((uint)*(ulong *)&cl->field_0x38 & 0xfffff);
    local_118 = (_func_int **)&PTR__FirstOrderSubtermIt_00b69970;
    local_108 = (_func_int **)&PTR__InferenceExtra_00b66580;
    local_110 = 0;
    do {
      term = &cl->_literals[local_110]->super_Term;
      bVar10 = Kernel::Literal::isAnswerLiteral((Literal *)term);
      uVar22 = 4;
      if ((!bVar10) &&
         (((this->super_ForwardDemodulation)._skipNonequationalLiterals != true ||
          (term->_functor == 0)))) {
        Kernel::FirstOrderSubtermIt::FirstOrderSubtermIt(&local_c0,term,false);
        do {
          if (local_c0._stack._cursor == local_c0._stack._stack) {
            uVar22 = 0;
            break;
          }
          rwTerm._content = (uint64_t)Kernel::FirstOrderSubtermIt::next(&local_c0);
          local_f8 = Kernel::SortHelper::getResultSort((Term *)rwTerm._content);
          bVar10 = ::Lib::
                   DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
                   insert(&perform::attempted._map,rwTerm._content);
          if (bVar10) {
            bVar10 = DemodulationHelper::redundancyCheckNeededForPremise
                               (local_140,cl,(Literal *)term,rwTerm);
            pDVar4 = (this->super_ForwardDemodulation)._index;
            TVar15 = Kernel::SortHelper::getResultSort((Term *)rwTerm._content);
            pTVar5 = (pDVar4->super_TermIndex<Indexing::DemodulatorData>)._is._M_t.
                     super___uniq_ptr_impl<Indexing::TermIndexingStructure<Indexing::DemodulatorData>,_std::default_delete<Indexing::TermIndexingStructure<Indexing::DemodulatorData>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Indexing::TermIndexingStructure<Indexing::DemodulatorData>_*,_std::default_delete<Indexing::TermIndexingStructure<Indexing::DemodulatorData>_>_>
                     .
                     super__Head_base<0UL,_Indexing::TermIndexingStructure<Indexing::DemodulatorData>_*,_false>
                     ._M_head_impl;
            (*pTVar5->_vptr_TermIndexingStructure[6])
                      (&local_178,pTVar5,rwTerm._content,TVar15._content,1);
            do {
              cVar11 = (**(code **)(*local_178 + 0x10))();
              if (cVar11 == '\0') {
                uVar22 = 0;
                break;
              }
              (**(code **)(*local_178 + 0x18))(&local_190);
              if ((~*(uint *)&cl->field_0x38 & 0x300000) == 0) {
                Kernel::Clause::computeColor(cl);
              }
              uVar6 = *(undefined8 *)&cl->field_0x38;
              pCVar18 = (Clause *)local_180[3];
              if ((~*(uint *)&pCVar18->field_0x38 & 0x300000) == 0) {
                Kernel::Clause::computeColor(pCVar18);
              }
              uVar22 = 7;
              if ((~((uint)uVar6 | *(uint *)&pCVar18->field_0x38) & 0x300000) != 0) {
                pp_Var7 = (_func_int **)*local_180;
                if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                     ::eqSortSubs == '\0') &&
                   (iVar14 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                                  ::eqSortSubs), iVar14 != 0)) {
                  Kernel::RobSubstitution::RobSubstitution(&perform::eqSortSubs);
                  __cxa_atexit(Kernel::RobSubstitution::~RobSubstitution,&perform::eqSortSubs,
                               &__dso_handle);
                  __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                       ::eqSortSubs);
                }
                local_170._content = (uint64_t)pp_Var7;
                if (((ulong)pp_Var7 & 1) != 0) {
                  Kernel::RobSubstitution::reset(&perform::eqSortSubs);
                  bVar12 = Kernel::RobSubstitution::match
                                     (&perform::eqSortSubs,(TermList)local_180[1],0,local_f8,1);
                  uVar22 = 7;
                  if (!bVar12) goto LAB_004d9cf9;
                }
                local_128 = local_190;
                local_120 = local_188;
                if (local_188 != (int *)0x0 && local_190 != (long *)0x0) {
                  *local_188 = *local_188 + 1;
                }
                local_78 = &PTR__SubstApplicator_00b64888;
                local_70 = local_190;
                local_68 = &perform::eqSortSubs;
                local_88 = &PTR__SubstApplicator_00b648c8;
                local_80 = local_190;
                ctx = (EVP_PKEY_CTX *)&local_78;
                if ((local_170._content & 1) == 0) {
                  ctx = (EVP_PKEY_CTX *)&local_88;
                }
                TVar15._content = local_180[2];
                uVar21 = TVar15._content & 1;
                if (uVar21 != 0) {
                  TVar15._content =
                       (**(code **)(*(long *)ctx + 0x10))(ctx,TVar15._content >> 2 & 0xffffffff);
                }
                uVar19 = local_180[4];
                if ((this->super_ForwardDemodulation)._useTermOrderingDiagrams == true) {
                  Kernel::TermOrderingDiagram::init((TermOrderingDiagram *)local_180[5],ctx);
                  if (((char)uVar19 == '\0') &&
                     (((this->super_ForwardDemodulation)._preorderedOnly != false ||
                      (pvVar16 = Kernel::TermOrderingDiagram::next
                                           ((TermOrderingDiagram *)local_180[5]),
                      pvVar16 == (void *)0x0)))) goto LAB_004d9cb1;
LAB_004d98e4:
                  if ((bVar10 != false) && ((this->super_ForwardDemodulation)._encompassing == true)
                     ) {
                    RVar13 = Kernel::Ordering::getEqualityArgumentOrder(local_150,(Literal *)term);
                    uVar19 = (ulong)(*(uint *)&term->field_0xc & 0xfffffff);
                    if (((RVar13 == LESS) && (term->_args[uVar19]._content == rwTerm._content)) ||
                       ((RVar13 == GREATER && (term->_args[uVar19 - 1]._content == rwTerm._content))
                       )) {
                      bVar10 = false;
                    }
                  }
                  if (uVar21 == 0) {
                    TVar15 = Kernel::SubstHelper::applyImpl<false,Kernel::SubstApplicator_const>
                                       (TVar15,(SubstApplicator *)ctx,false);
                  }
                  if (bVar10 != false) {
                    bVar12 = DemodulationHelper::isPremiseRedundant
                                       (local_140,cl,(Literal *)term,rwTerm,TVar15,local_170,
                                        (SubstApplicator *)ctx);
                    uVar22 = 7;
                    if (!bVar12) goto LAB_004d9cb6;
                  }
                  pLVar17 = Kernel::EqHelper::replace((Literal *)term,rwTerm,TVar15);
                  if ((((pLVar17->super_Term)._functor == 0) &&
                      (((pLVar17->super_Term)._args[0]._content & 4) != 0)) &&
                     (uVar21 = (ulong)(*(uint *)&(pLVar17->super_Term).field_0xc & 0xfffffff),
                     (pLVar17->super_Term)._args[uVar21]._content ==
                     (pLVar17->super_Term)._args[uVar21 - 1]._content)) {
                    *(int *)(DAT_00b7e1c0 + 0x14c) = *(int *)(DAT_00b7e1c0 + 0x14c) + 1;
                    uVar21 = local_180[3];
                    local_168._0_8_ =
                         ::Lib::FixedSizeAllocator<32UL>::alloc
                                   ((FixedSizeAllocator<32UL> *)
                                    (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
                    ((IteratorCore<Kernel::Clause_*> *)local_168._0_8_)->_refCnt = 0;
                    ((IteratorCore<Kernel::Clause_*> *)local_168._0_8_)->_vptr_IteratorCore =
                         (_func_int **)&PTR__IteratorCore_00b63388;
                    *(undefined1 *)
                     &((IteratorCore<Kernel::Clause_*> *)(local_168._0_8_ + 0x10))->
                      _vptr_IteratorCore = 0;
                    *(ulong *)&((IteratorCore<Kernel::Clause_*> *)(local_168._0_8_ + 0x10))->_refCnt
                         = uVar21;
                    ((IteratorCore<Kernel::Clause_*> *)local_168._0_8_)->_refCnt = 1;
                    ::Lib::VirtualIterator<Kernel::Clause_*>::operator=
                              (local_148,(VirtualIterator<Kernel::Clause_*> *)&local_168);
                    if ((IteratorCore<Kernel::Clause_*> *)local_168._0_8_ !=
                        (IteratorCore<Kernel::Clause_*> *)0x0) {
                      piVar1 = (int *)(local_168._0_8_ + 8);
                      *piVar1 = *piVar1 + -1;
                      if (*piVar1 == 0) {
                        (**(code **)(*(long *)local_168._0_8_ + 8))();
                      }
                    }
                  }
                  else {
                    ::Lib::
                    Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    ::Recycled(&local_138);
                    SVar9._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                         (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                          )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                            )local_138._self;
                    if (*(Literal ***)
                         ((long)local_138._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x10) ==
                        *(Literal ***)
                         ((long)local_138._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x18)) {
                      ::Lib::Stack<Kernel::Literal_*>::expand
                                ((Stack<Kernel::Literal_*> *)
                                 local_138._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                 _M_head_impl);
                    }
                    **(Literal ***)
                      ((long)SVar9._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                             _M_head_impl + 0x10) = pLVar17;
                    pppLVar2 = (Literal ***)
                               ((long)SVar9._M_t.
                                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                      ._M_head_impl + 0x10);
                    *pppLVar2 = *pppLVar2 + 1;
                    uVar21 = 0;
                    do {
                      SVar9._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                           (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                            )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                              )local_138._self;
                      pTVar8 = &cl->_literals[uVar21]->super_Term;
                      if (pTVar8 != term) {
                        if (*(Literal ***)
                             ((long)local_138._self._M_t.
                                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                    _M_head_impl + 0x10) ==
                            *(Literal ***)
                             ((long)local_138._self._M_t.
                                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                    _M_head_impl + 0x18)) {
                          ::Lib::Stack<Kernel::Literal_*>::expand
                                    ((Stack<Kernel::Literal_*> *)
                                     local_138._self._M_t.
                                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                     _M_head_impl);
                        }
                        **(Literal ***)
                          ((long)SVar9._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                 _M_head_impl + 0x10) = (Literal *)pTVar8;
                        pppLVar2 = (Literal ***)
                                   ((long)SVar9._M_t.
                                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                          .
                                          super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                          ._M_head_impl + 0x10);
                        *pppLVar2 = *pppLVar2 + 1;
                      }
                      uVar21 = uVar21 + 1;
                    } while (uVar20 != uVar21);
                    *(int *)(DAT_00b7e1c0 + 0x148) = *(int *)(DAT_00b7e1c0 + 0x148) + 1;
                    uVar21 = local_180[3];
                    local_168._0_8_ =
                         ::Lib::FixedSizeAllocator<32UL>::alloc
                                   ((FixedSizeAllocator<32UL> *)
                                    (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
                    ((IteratorCore<Kernel::Clause_*> *)local_168._0_8_)->_refCnt = 0;
                    ((IteratorCore<Kernel::Clause_*> *)local_168._0_8_)->_vptr_IteratorCore =
                         (_func_int **)&PTR__IteratorCore_00b63388;
                    *(undefined1 *)
                     &((IteratorCore<Kernel::Clause_*> *)(local_168._0_8_ + 0x10))->
                      _vptr_IteratorCore = 0;
                    *(ulong *)&((IteratorCore<Kernel::Clause_*> *)(local_168._0_8_ + 0x10))->_refCnt
                         = uVar21;
                    ((IteratorCore<Kernel::Clause_*> *)local_168._0_8_)->_refCnt = 1;
                    ::Lib::VirtualIterator<Kernel::Clause_*>::operator=
                              (local_148,(VirtualIterator<Kernel::Clause_*> *)&local_168);
                    if ((IteratorCore<Kernel::Clause_*> *)local_168._0_8_ !=
                        (IteratorCore<Kernel::Clause_*> *)0x0) {
                      piVar1 = (int *)(local_168._0_8_ + 8);
                      *piVar1 = *piVar1 + -1;
                      if (*piVar1 == 0) {
                        (**(code **)(*(long *)local_168._0_8_ + 8))();
                      }
                    }
                    SVar9._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                         local_138._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                    ;
                    local_168.premise2 = (Clause *)local_180[3];
                    local_168.rule = 0x18;
                    local_168.premise1 = cl;
                    Kernel::Inference::Inference(&local_60,&local_168);
                    TVar15._content = local_170._content;
                    pCVar18 = Kernel::Clause::fromStack
                                        ((Stack<Kernel::Literal_*> *)
                                         SVar9._M_t.
                                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                         .
                                         super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                         ._M_head_impl,&local_60);
                    *local_100 = pCVar18;
                    if (*(int *)(::Lib::env + 0x85a8) == 2) {
                      extra = (InferenceExtra *)::operator_new(0x18);
                      extra->_vptr_InferenceExtra = local_108;
                      extra[1]._vptr_InferenceExtra = (_func_int **)TVar15._content;
                      extra[2]._vptr_InferenceExtra = (_func_int **)rwTerm._content;
                      ::Lib::ProofExtra::insert
                                ((ProofExtra *)&DAT_00b7e1d8,&pCVar18->super_Unit,extra);
                    }
                    ::Lib::
                    Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    ::~Recycled(&local_138);
                  }
                  uVar22 = 1;
                }
                else {
                  if ((char)uVar19 != '\0') goto LAB_004d98e4;
                  if ((this->super_ForwardDemodulation)._preorderedOnly == false) {
                    bStack_e8 = (byte)uVar21 ^ 1;
                    uStack_d0 = uStack_d0 & 0xffffff00;
                    local_c8 = 0;
                    local_f0 = TVar15._content;
                    local_e0 = ctx;
                    local_d8 = rwTerm._content;
                    iVar14 = (*local_150->_vptr_Ordering[5])();
                    if (iVar14 == 1) goto LAB_004d98e4;
                  }
LAB_004d9cb1:
                  uVar22 = 7;
                }
LAB_004d9cb6:
                if (((local_128 != (long *)0x0) && (local_120 != (int *)0x0)) &&
                   ((*local_120 = *local_120 + -1, *local_120 == 0 &&
                    ((**(code **)(*local_128 + 8))(), local_120 != (int *)0x0)))) {
                  *(undefined8 *)local_120 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                  ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_120;
                }
              }
LAB_004d9cf9:
              if (((local_190 != (long *)0x0) && (local_188 != (int *)0x0)) &&
                 ((*local_188 = *local_188 + -1, *local_188 == 0 &&
                  ((**(code **)(*local_190 + 8))(), local_188 != (int *)0x0)))) {
                *(undefined8 *)local_188 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_188;
              }
            } while (uVar22 == 7);
            if (local_178 != (long *)0x0) {
              plVar3 = local_178 + 1;
              *(int *)plVar3 = (int)*plVar3 + -1;
              if ((int)*plVar3 == 0) {
                (**(code **)(*local_178 + 8))();
              }
            }
          }
          else {
            uVar22 = 5;
            Kernel::FirstOrderSubtermIt::right(&local_c0);
          }
        } while ((uVar22 == 5) || (uVar22 == 0));
        local_c0.super_IteratorCore<Kernel::Term_*>._vptr_IteratorCore = local_118;
        if (local_c0._stack._stack != (Term **)0x0) {
          uVar21 = local_c0._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
          if (uVar21 == 0) {
            *local_c0._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_c0._stack._stack;
          }
          else if (uVar21 < 0x11) {
            *local_c0._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_c0._stack._stack;
          }
          else if (uVar21 < 0x19) {
            *local_c0._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_c0._stack._stack;
          }
          else if (uVar21 < 0x21) {
            *local_c0._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_c0._stack._stack;
          }
          else if (uVar21 < 0x31) {
            *local_c0._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_c0._stack._stack;
          }
          else if (uVar21 < 0x41) {
            *local_c0._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_c0._stack._stack;
          }
          else {
            operator_delete(local_c0._stack._stack,0x10);
          }
        }
      }
      if ((uVar22 & 3) != 0) goto LAB_004d9ece;
      local_110 = local_110 + 1;
    } while (local_110 != uVar20);
    uVar22 = 2;
LAB_004d9ece:
    bVar10 = uVar22 != 2;
  }
  return bVar10;
}

Assistant:

bool ForwardDemodulationImpl<combinatorySupSupport>::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  TIME_TRACE("forward demodulation");

  Ordering& ordering = _salg->getOrdering();

  //Perhaps it might be a good idea to try to
  //replace subterms in some special order, like
  //the heaviest first...

  static DHSet<TermList> attempted;
  attempted.reset();

  unsigned cLen=cl->length();
  for(unsigned li=0;li<cLen;li++) {
    Literal* lit=(*cl)[li];
    if (lit->isAnswerLiteral()) {
      continue;
    }
    if (_skipNonequationalLiterals && !lit->isEquality()) {
      continue;
    }
    typename std::conditional<!combinatorySupSupport,
      NonVariableNonTypeIterator,
      FirstOrderSubtermIt>::type it(lit);
    while(it.hasNext()) {
      TypedTermList trm = it.next();
      if(!attempted.insert(trm)) {
        //We have already tried to demodulate the term @b trm and did not
        //succeed (otherwise we would have returned from the function).
        //If we have tried the term @b trm, we must have tried to
        //demodulate also its subterms, so we can skip them too.
        it.right();
        continue;
      }

      bool redundancyCheck = _helper.redundancyCheckNeededForPremise(cl, lit, trm);

      auto git = _index->getGeneralizations(trm.term(), /* retrieveSubstitutions */ true);
      while(git.hasNext()) {
        auto qr=git.next();
        ASS_EQ(qr.data->clause->length(),1);

        if(!ColorHelper::compatible(cl->color(), qr.data->clause->color())) {
          continue;
        }

        auto lhs = qr.data->term;

        // TODO:
        // to deal with polymorphic matching
        // Ideally, we would like to extend the substitution
        // returned by the index to carry out the sort match.
        // However, ForwardDemodulation uses a CodeTree as its
        // indexing mechanism, and it is not clear how to extend
        // the substitution returned by a code tree.
        static RobSubstitution eqSortSubs;
        if(lhs.isVar()){
          eqSortSubs.reset();
          TermList querySort = trm.sort();
          TermList eqSort = qr.data->term.sort();
          if(!eqSortSubs.match(eqSort, 0, querySort, 1)){
            continue;
          }
        }

        auto subs = qr.unifier;
        ASS(subs->isIdentityOnQueryWhenResultBound());

        ApplicatorWithEqSort applWithEqSort(subs.ptr(), eqSortSubs);
        Applicator applWithoutEqSort(subs.ptr());
        auto appl = lhs.isVar() ? (SubstApplicator*)&applWithEqSort : (SubstApplicator*)&applWithoutEqSort;

        AppliedTerm rhsApplied(qr.data->rhs,appl,true);
        bool preordered = qr.data->preordered;

        ASS_EQ(ordering.compare(trm,rhsApplied),Ordering::reverse(ordering.compare(rhsApplied,trm)));

        if (_useTermOrderingDiagrams) {
#if VDEBUG
          auto dcomp = ordering.compareUnidirectional(trm,rhsApplied);
#endif
          qr.data->tod->init(appl);
          if (!preordered && (_preorderedOnly || !qr.data->tod->next())) {
            ASS_NEQ(dcomp,Ordering::GREATER);
            continue;
          }
          ASS_EQ(dcomp,Ordering::GREATER);
        } else {
          if (!preordered && (_preorderedOnly || ordering.compareUnidirectional(trm,rhsApplied)!=Ordering::GREATER)) {
            continue;
          }
        }

        // encompassing demodulation is fine when rewriting the smaller guy
        if (redundancyCheck && _encompassing) {
          // this will only run at most once;
          // could have been factored out of the getGeneralizations loop,
          // but then it would run exactly once there
          Ordering::Result litOrder = ordering.getEqualityArgumentOrder(lit);
          if ((trm==*lit->nthArgument(0) && litOrder == Ordering::LESS) ||
              (trm==*lit->nthArgument(1) && litOrder == Ordering::GREATER)) {
            redundancyCheck = false;
          }
        }

        TermList rhsS = rhsApplied.apply();

        if (redundancyCheck && !_helper.isPremiseRedundant(cl, lit, trm, rhsS, lhs, appl)) {
          continue;
        }

        Literal* resLit = EqHelper::replace(lit,trm,rhsS);
        if(EqHelper::isEqTautology(resLit)) {
          env.statistics->forwardDemodulationsToEqTaut++;
          premises = pvi( getSingletonIterator(qr.data->clause));
          return true;
        }

        RStack<Literal*> resLits;
        resLits->push(resLit);

        for(unsigned i=0;i<cLen;i++) {
          Literal* curr=(*cl)[i];
          if(curr!=lit) {
            resLits->push(curr);
          }
        }

        env.statistics->forwardDemodulations++;

        premises = pvi( getSingletonIterator(qr.data->clause));
        replacement = Clause::fromStack(*resLits, SimplifyingInference2(InferenceRule::FORWARD_DEMODULATION, cl, qr.data->clause));
        if(env.options->proofExtra() == Options::ProofExtra::FULL)
          env.proofExtra.insert(replacement, new ForwardDemodulationExtra(lhs, trm));
        return true;
      }
    }
  }

  return false;
}